

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::copyable_holder_caster<kratos::Var,_std::shared_ptr<kratos::Var>,_void>::
load_value(copyable_holder_caster<kratos::Var,_std::shared_ptr<kratos::Var>,_void> *this,
          value_and_holder *v_h)

{
  void **ppvVar1;
  bool bVar2;
  cast_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  allocator<char> local_21;
  
  bVar2 = value_and_holder::holder_constructed(v_h);
  if (bVar2) {
    ppvVar1 = v_h->vh;
    (this->super_type_caster_base<kratos::Var>).super_type_caster_generic.value = *ppvVar1;
    std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->holder).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)(ppvVar1 + 1));
    return true;
  }
  this_00 = (cast_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"St10shared_ptrIN6kratos3VarEE",&local_21);
  clean_type_id(&local_48);
  std::operator+(&local_68,
                 "Unable to cast from non-held to held instance (T& to Holder<T>) of type \'",
                 &local_48);
  std::operator+(&local_88,&local_68,"\'\'");
  cast_error::runtime_error(this_00,&local_88);
  __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool load_value(value_and_holder &&v_h) {
        if (v_h.holder_constructed()) {
            value = v_h.value_ptr();
            holder = v_h.template holder<holder_type>();
            return true;
        }
        throw cast_error("Unable to cast from non-held to held instance (T& to Holder<T>) "
#if defined(NDEBUG)
                         "(compile in debug mode for type information)");
#else
                         "of type '"
                         + type_id<holder_type>() + "''");
#endif
    }